

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::ModeFallbackFunction<duckdb::ModeString>::
     Finalize<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *state,
               AggregateFinalizeData *finalize_data)

{
  ulong uVar1;
  string_t sVar2;
  bool bVar3;
  pointer pvVar4;
  undefined8 *in_RSI;
  long in_RDI;
  AggregateFinalizeData *unaff_retaddr;
  const_iterator highest_frequency;
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *in_stack_ffffffffffffffb8;
  Vector *pVVar5;
  OrderModifiers local_32;
  undefined8 local_30;
  char *local_28;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true> local_20;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
  in_stack_ffffffffffffffe8;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    AggregateFinalizeData::ReturnNull(unaff_retaddr);
  }
  else {
    ModeState<duckdb::string_t,_duckdb::ModeString>::Scan
              ((ModeState<duckdb::string_t,_duckdb::ModeString> *)in_stack_ffffffffffffffe8._M_cur);
    local_20._M_cur =
         (__node_type *)
         OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar3 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                        *)&stack0xffffffffffffffe8,&local_20);
    if (bVar3) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                             *)0xaf7aaa);
      local_30 = *(undefined8 *)&(pvVar4->first).value;
      local_28 = (pvVar4->first).value.pointer.ptr;
      pVVar5 = (Vector *)*in_RSI;
      uVar1 = in_RSI[2];
      OrderModifiers::OrderModifiers(&local_32,ASCENDING,NULLS_LAST);
      sVar2.value.pointer.ptr = local_28;
      sVar2.value._0_8_ = local_30;
      duckdb::CreateSortKeyHelpers::DecodeSortKey(sVar2,pVVar5,uVar1,local_32);
    }
    else {
      AggregateFinalizeData::ReturnNull(unaff_retaddr);
    }
  }
  return;
}

Assistant:

static void Finalize(STATE &state, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			CreateSortKeyHelpers::DecodeSortKey(highest_frequency->first, finalize_data.result,
			                                    finalize_data.result_idx,
			                                    OrderModifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST));
		} else {
			finalize_data.ReturnNull();
		}
	}